

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>
::WriteCon2JSON(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
                *this,MemoryWriter *wrt,int i_con,Container *cnt)

{
  int iVar1;
  char *pcVar2;
  Container *in_RCX;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_RSI;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> jw;
  char **in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffed8;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *in_stack_fffffffffffffee0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff08;
  string_view in_stack_ffffffffffffff10;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *in_stack_ffffffffffffff38;
  JSONW *in_stack_ffffffffffffff40;
  BasicConstraintKeeper *in_stack_ffffffffffffff80;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> local_30;
  Container *local_20;
  
  local_20 = in_RCX;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::MiniJSONWriter
            (&local_30,in_RSI);
  BasicConstraintKeeper::GetShortTypeName(in_stack_ffffffffffffff80);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_stack_fffffffffffffec8
            );
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x1a8d15);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (int *)in_stack_fffffffffffffec8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x1a8d74);
  Container::GetCon((Container *)0x1a8d81);
  pcVar2 = BasicConstraint::name((BasicConstraint *)0x1a8d92);
  if (*pcVar2 != '\0') {
    in_stack_fffffffffffffee0 = Container::GetCon((Container *)0x1a8db4);
    in_stack_fffffffffffffed8 = BasicConstraint::name((BasicConstraint *)0x1a8dc5);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8);
    MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
              ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x1a8e38);
  }
  iVar1 = Container::GetDepth(local_20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
             CONCAT44(iVar1,in_stack_fffffffffffffed0),(int *)in_stack_fffffffffffffec8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x1a8f33);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  Container::GetCon((Container *)0x1a8f6f);
  WriteJSON<mp::LinTerms,mp::AlgConRhs<_1>>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x1a8f8f);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x1a8f9c);
  return;
}

Assistant:

void WriteCon2JSON(
      fmt::MemoryWriter& wrt, int i_con, const Container& cnt) {
    MiniJSONWriter jw(wrt);
    jw["CON_TYPE"] = GetShortTypeName();
    jw["index"] = i_con;
    if (*cnt.GetCon().name())
      jw["name"] = cnt.GetCon().name();
    jw["depth"] = cnt.GetDepth();
    WriteJSON(jw["data"], cnt.GetCon());
  }